

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase315::run(TestCase315 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  int iVar2;
  byte bVar3;
  size_t __n;
  bool bVar4;
  ArrayPtr<const_char> AVar5;
  Schema dep;
  Schema schema;
  DebugExpression<bool> _kjCondition;
  SchemaLoader loader;
  undefined1 local_218 [16];
  undefined1 local_208 [32];
  char *local_1e8;
  size_t local_1e0;
  bool local_1d8;
  Reader local_1d0;
  Reader local_1a0;
  ArrayPtr<const_char> local_170;
  SchemaLoader local_160;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Schema local_d8;
  ArrayPtr<const_char> local_d0;
  PointerReader local_c0;
  LazyLoadCallback local_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  byte local_68;
  Reader local_60;
  
  local_170.size_ = (size_t)local_170.ptr;
  local_208._8_8_ = local_208._0_8_;
  local_208._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  Schema::getProto(&local_60,(Schema *)local_208);
  local_78 = local_60._reader.dataSize;
  SStack_74 = local_60._reader.pointerCount;
  uStack_72 = local_60._reader._38_2_;
  iStack_70 = local_60._reader.nestingLimit;
  uStack_6c = local_60._reader._44_4_;
  local_88 = local_60._reader.data;
  pWStack_80 = local_60._reader.pointers;
  local_98 = local_60._reader.segment;
  pCStack_90 = local_60._reader.capTable;
  local_a0._vptr_LazyLoadCallback = (_func_int **)&PTR_load_006e3bf8;
  local_68 = 0;
  SchemaLoader::SchemaLoader(&local_160,&local_a0);
  local_1d0._reader.segment = (SegmentReader *)(schemas::s_eb3f9ebe98c73cb6 + 0x48);
  Schema::getProto((Reader *)local_208,(Schema *)&local_1d0);
  local_218._8_8_ = SchemaLoader::load(&local_160,(Reader *)local_208);
  bVar3 = local_68 ^ 1;
  local_208[0] = (bool)bVar3;
  if ((local_68 == 1) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x141,ERROR,"\"failed: expected \" \"!(callback.isLoaded())\", _kjCondition",
               (char (*) [40])"failed: expected !(callback.isLoaded())",
               (DebugExpression<bool> *)local_208);
  }
  local_218._0_8_ = Schema::getDependency((Schema *)(local_218 + 8),0xa0a8f314b80b63fd,0);
  local_208[0] = (bool)local_68;
  if ((local_68 == 0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x145,ERROR,"\"failed: expected \" \"callback.isLoaded()\", _kjCondition",
               (char (*) [37])"failed: expected callback.isLoaded()",
               (DebugExpression<bool> *)local_208);
  }
  Schema::getProto(&local_1d0,(Schema *)local_218);
  local_1a0._reader.capTable = local_1d0._reader.capTable;
  local_1a0._reader.data = local_1d0._reader.pointers;
  local_1a0._reader.segment = local_1d0._reader.segment;
  local_1a0._reader.pointers._0_4_ = local_1d0._reader.nestingLimit;
  if (local_1d0._reader.pointerCount == 0) {
    local_1a0._reader.capTable = (CapTableReader *)0x0;
    local_1a0._reader.data = (WirePointer *)0x0;
    local_1a0._reader.segment = (SegmentReader *)(RawBrandedSchema *)0x0;
    local_1a0._reader.pointers._0_4_ = 0x7fffffff;
  }
  AVar5 = (ArrayPtr<const_char>)
          PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1a0,(void *)0x0,0);
  __n = AVar5.size_;
  local_170.ptr = schemas::s_a0a8f314b80b63fd + 0x48;
  Schema::getProto(&local_1a0,(Schema *)&local_170);
  if (local_1a0._reader.pointerCount == 0) {
    local_c0.nestingLimit = 0x7fffffff;
    local_c0.capTable = (CapTableReader *)0x0;
    local_c0.pointer = (WirePointer *)0x0;
    local_c0.segment = (SegmentReader *)0x0;
  }
  else {
    local_c0.pointer =
         (WirePointer *)CONCAT44(local_1a0._reader.pointers._4_4_,(int)local_1a0._reader.pointers);
    local_c0.capTable = local_1a0._reader.capTable;
    local_c0.segment = local_1a0._reader.segment;
    local_c0.nestingLimit = local_1a0._reader.nestingLimit;
  }
  local_208._16_16_ = (undefined1  [16])PointerReader::getBlob<capnp::Text>(&local_c0,(void *)0x0,0)
  ;
  if (__n == local_208._24_8_) {
    if (__n == 0) {
      local_1d8 = true;
    }
    else {
      iVar2 = bcmp(AVar5.ptr,local_208._16_8_,__n);
      local_1d8 = iVar2 == 0;
    }
  }
  else {
    local_1d8 = false;
  }
  local_1e8 = " == ";
  local_1e0 = 5;
  local_208._0_16_ = (undefined1  [16])AVar5;
  if ((local_1d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto(&local_1d0,(Schema *)local_218);
    local_1a0._reader.segment = local_1d0._reader.segment;
    if (local_1d0._reader.pointerCount == 0) {
      local_1d0._reader.nestingLimit = 0x7fffffff;
      local_1d0._reader.capTable = (CapTableReader *)0x0;
      local_1d0._reader.pointers = (WirePointer *)0x0;
      local_1a0._reader.segment = (SegmentReader *)(RawBrandedSchema *)0x0;
    }
    local_1a0._reader.capTable = local_1d0._reader.capTable;
    local_1a0._reader.data = local_1d0._reader.pointers;
    local_1a0._reader.pointers._0_4_ = local_1d0._reader.nestingLimit;
    local_170 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1a0,(void *)0x0,0);
    local_d8.raw = (RawBrandedSchema *)(schemas::s_a0a8f314b80b63fd + 0x48);
    Schema::getProto(&local_1a0,&local_d8);
    if (local_1a0._reader.pointerCount == 0) {
      local_1a0._reader.nestingLimit = 0x7fffffff;
      local_c0.capTable = (CapTableReader *)0x0;
      local_c0.pointer = (WirePointer *)0x0;
      local_c0.segment = (SegmentReader *)0x0;
    }
    else {
      local_c0.pointer =
           (WirePointer *)CONCAT44(local_1a0._reader.pointers._4_4_,(int)local_1a0._reader.pointers)
      ;
      local_c0.capTable = local_1a0._reader.capTable;
      local_c0.segment = local_1a0._reader.segment;
    }
    local_c0.nestingLimit = local_1a0._reader.nestingLimit;
    local_d0 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_c0,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[113],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x148,ERROR,
               "\"failed: expected \" \"(dep.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())\", _kjCondition, dep.getProto().getDisplayName(), Schema::from<TestAllTypes>().getProto().getDisplayName()"
               ,(char (*) [113])
                "failed: expected (dep.getProto().getDisplayName()) == (Schema::from<TestAllTypes>().getProto().getDisplayName())"
               ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_208,
               (Reader *)&local_170,(Reader *)&local_d0);
  }
  local_208._8_8_ = Schema::getDependency((Schema *)(local_218 + 8),0xa0a8f314b80b63fd,0);
  bVar4 = local_218._0_8_ == local_208._8_8_;
  local_208._16_8_ = " == ";
  local_208._24_8_ = &DAT_00000005;
  local_208._0_8_ = (RawBrandedSchema *)local_218;
  local_1e8._0_1_ = bVar4;
  if ((!bVar4) && (kj::_::Debug::minSeverity < 3)) {
    local_1d0._reader.segment =
         (SegmentReader *)Schema::getDependency((Schema *)(local_218 + 8),0xa0a8f314b80b63fd,0);
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x14a,ERROR,
               "\"failed: expected \" \"(dep) == (schema.getDependency(typeId<TestAllTypes>()))\", _kjCondition, dep, schema.getDependency(typeId<TestAllTypes>())"
               ,(char (*) [73])
                "failed: expected (dep) == (schema.getDependency(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_208,(Schema *)local_218,
               (Schema *)&local_1d0);
  }
  local_e8 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  uStack_e0 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  local_208._8_8_ = SchemaLoader::get(&local_160,0xa0a8f314b80b63fd,brand,(Schema)0x6ff7f8);
  local_208._0_8_ = (RawBrandedSchema *)local_218;
  local_208._24_8_ = 5;
  local_208._16_8_ = " == ";
  local_1e8 = (char *)CONCAT71(local_1e8._1_7_,local_218._0_8_ == local_208._8_8_);
  if ((local_218._0_8_ != local_208._8_8_) && (kj::_::Debug::minSeverity < 3)) {
    local_118 = 0;
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0;
    uStack_120 = 0;
    uStack_110 = 0x7fffffff;
    auVar1 = ZEXT1640(ZEXT816(0));
    brand_00._reader._40_8_ = 0x7fffffff;
    brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand_00._reader.data = (void *)auVar1._16_8_;
    brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand_00._reader.dataSize = auVar1._32_4_;
    brand_00._reader.pointerCount = auVar1._36_2_;
    brand_00._reader._38_2_ = auVar1._38_2_;
    local_1d0._reader.segment =
         (SegmentReader *)SchemaLoader::get(&local_160,0xa0a8f314b80b63fd,brand_00,(Schema)0x6ff7f8)
    ;
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&,capnp::Schema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x14b,ERROR,
               "\"failed: expected \" \"(dep) == (loader.get(typeId<TestAllTypes>()))\", _kjCondition, dep, loader.get(typeId<TestAllTypes>())"
               ,(char (*) [63])"failed: expected (dep) == (loader.get(typeId<TestAllTypes>()))",
               (DebugComparison<capnp::Schema_&,_capnp::Schema> *)local_208,(Schema *)local_218,
               (Schema *)&local_1d0);
  }
  SchemaLoader::~SchemaLoader(&local_160);
  return;
}

Assistant:

TEST(SchemaLoader, LazyLoadGetDependency) {
  FakeLoaderCallback callback(Schema::from<TestAllTypes>().getProto());
  SchemaLoader loader(callback);

  Schema schema = loader.load(Schema::from<TestDefaults>().getProto());

  EXPECT_FALSE(callback.isLoaded());

  Schema dep = schema.getDependency(typeId<TestAllTypes>());

  EXPECT_TRUE(callback.isLoaded());

  EXPECT_EQ(dep.getProto().getDisplayName(),
            Schema::from<TestAllTypes>().getProto().getDisplayName());

  EXPECT_EQ(dep, schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_EQ(dep, loader.get(typeId<TestAllTypes>()));
}